

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

u32 utilFNV32(void *buf,size_t count,u32 state)

{
  size_t sVar1;
  octet *octets;
  
  if (count != 0) {
    sVar1 = 0;
    do {
      state = (*(byte *)((long)buf + sVar1) ^ state) * 0x1000193;
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return state;
}

Assistant:

u32 utilFNV32(const void* buf, size_t count, u32 state)
{
	const octet* octets = (const octet*)buf;
	while (count--)
	{
		state ^= *octets++;
		state += (state << 1) + (state << 4) + (state << 7) +
			(state << 8) + (state << 24);
	}
	return state;
}